

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qualify_binder.cpp
# Opt level: O1

void __thiscall
duckdb::QualifyBinder::QualifyBinder
          (QualifyBinder *this,Binder *binder,ClientContext *context,BoundSelectNode *node,
          BoundGroupInformation *info)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  LogicalType local_40;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  
  ExpressionBinder::ExpressionBinder((ExpressionBinder *)this,binder,context,false);
  (this->super_BaseSelectBinder).inside_window = false;
  (this->super_BaseSelectBinder).bound_aggregate = false;
  (this->super_BaseSelectBinder).node = node;
  (this->super_BaseSelectBinder).info = info;
  (this->super_BaseSelectBinder).super_ExpressionBinder._vptr_ExpressionBinder =
       (_func_int **)&PTR__QualifyBinder_0248e940;
  ColumnAliasBinder::ColumnAliasBinder(&this->column_alias_binder,&node->bind_state);
  LogicalType::LogicalType(&local_40,BOOLEAN);
  _Var2._M_pi = local_40.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  peVar1 = local_40.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->super_BaseSelectBinder).super_ExpressionBinder.target_type.id_ = local_40.id_;
  (this->super_BaseSelectBinder).super_ExpressionBinder.target_type.physical_type_ =
       local_40.physical_type_;
  uVar3 = *(undefined4 *)
           &(this->super_BaseSelectBinder).super_ExpressionBinder.target_type.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar4 = *(undefined4 *)
           ((long)&(this->super_BaseSelectBinder).super_ExpressionBinder.target_type.type_info_.
                   internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr + 4);
  uVar5 = *(undefined4 *)
           &(this->super_BaseSelectBinder).super_ExpressionBinder.target_type.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  uVar6 = *(undefined4 *)
           ((long)&(this->super_BaseSelectBinder).super_ExpressionBinder.target_type.type_info_.
                   internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount + 4);
  (this->super_BaseSelectBinder).super_ExpressionBinder.target_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0
  ;
  (this->super_BaseSelectBinder).super_ExpressionBinder.target_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_40.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_40.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->super_BaseSelectBinder).super_ExpressionBinder.target_type.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (this->super_BaseSelectBinder).super_ExpressionBinder.target_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1;
  (this->super_BaseSelectBinder).super_ExpressionBinder.target_type.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    local_28 = uVar3;
    uStack_24 = uVar4;
    uStack_20 = uVar5;
    uStack_1c = uVar6;
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
    uVar3 = local_28;
    uVar4 = uStack_24;
    uVar5 = uStack_20;
    uVar6 = uStack_1c;
  }
  _Var2._M_pi = local_40.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi;
  local_40.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)CONCAT44(uVar4,uVar3);
  local_40.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._4_4_ = uVar6;
  local_40.type_info_.internal.super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi._0_4_ = uVar5;
  if (_Var2._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var2._M_pi);
  }
  LogicalType::~LogicalType(&local_40);
  return;
}

Assistant:

QualifyBinder::QualifyBinder(Binder &binder, ClientContext &context, BoundSelectNode &node, BoundGroupInformation &info)
    : BaseSelectBinder(binder, context, node, info), column_alias_binder(node.bind_state) {
	target_type = LogicalType(LogicalTypeId::BOOLEAN);
}